

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::f
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  bool bVar31;
  int i;
  BxDFFlags BVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  byte bVar37;
  uint uVar38;
  uint uVar39;
  uint64_t oldstate;
  TransportMode mode_00;
  code *this_00;
  ulong uVar40;
  TransportMode TVar41;
  long in_FS_OFFSET;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  Float FVar46;
  float fVar45;
  float extraout_XMM0_Dc;
  ulong in_XMM0_Qb;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float extraout_XMM0_Db;
  float extraout_XMM0_Dd;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar71 [56];
  undefined1 auVar66 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar75 [16];
  undefined1 auVar93 [56];
  undefined1 auVar89 [64];
  ulong in_XMM2_Qb;
  undefined1 auVar94 [16];
  uint in_XMM3_Db;
  uint in_XMM3_Dd;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 in_ZMM4 [64];
  undefined4 in_XMM6_Da;
  undefined1 in_register_00001384 [12];
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3f wo_03;
  Vector3f VVar98;
  Vector3f wo_05;
  Vector3f wo_06;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3f wo_09;
  Vector3f wo_10;
  Vector3f wi_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3f wi_05;
  Vector3f wi_06;
  SampledSpectrum SVar99;
  Vector3f w;
  SampledSpectrum beta;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> exitInterface;
  Float g;
  optional<pbrt::PhaseFunctionSample> ps;
  optional<pbrt::BSDFSample> wis;
  Float f_1;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> nonExitInterface;
  Float pdf;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> enterInterface;
  optional<pbrt::BSDFSample> wos;
  Vector3f local_208;
  TransportMode TStack_1fc;
  undefined1 local_1f8 [4];
  float afStack_1f4 [3];
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_1e8;
  ushort local_1ca;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [4];
  Vector3f VStack_1a4;
  Vector3f local_198 [2];
  bool local_17c;
  undefined1 local_178 [4];
  float afStack_174 [3];
  Vector3f local_168 [2];
  bool local_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  float local_138;
  uint uStack_134;
  undefined4 uStack_130;
  uint uStack_12c;
  float local_11c;
  float local_118;
  float local_114;
  uint local_110;
  float local_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_f8;
  ulong local_e8;
  ulong uStack_e0;
  undefined1 local_d8 [4];
  float afStack_d4 [4];
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_b8;
  float local_a8;
  float local_a4;
  TransportMode local_a0;
  uint local_9c;
  ulong local_98;
  ulong uStack_90;
  undefined1 local_88 [16];
  undefined1 local_78 [4];
  float afStack_74 [10];
  bool local_4c;
  undefined1 local_48 [16];
  Vector3f wo_04;
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar83 [16];
  
  local_138 = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  local_e8 = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar66._4_60_ = wo._12_60_;
  auVar66._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_98 = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uStack_130 = 0;
  local_48 = auVar66._0_16_;
  uStack_134 = in_XMM3_Db;
  uStack_12c = in_XMM3_Dd;
  uStack_e0 = in_XMM2_Qb;
  uStack_90 = in_XMM0_Qb;
  if (((this->config).twoSided != '\0') && (auVar66._0_4_ < 0.0)) {
    local_98 = local_98 ^ 0x8000000080000000;
    uStack_90 = in_XMM0_Qb ^ 0x8000000080000000;
    local_48._0_8_ = CONCAT44(wo._12_4_,auVar66._0_4_) ^ 0x8000000080000000;
    local_48._8_4_ = wo._16_4_ ^ 0x80000000;
    local_48._12_4_ = wo._20_4_ ^ 0x80000000;
    local_e8 = local_e8 ^ 0x8000000080000000;
    uStack_e0 = in_XMM2_Qb ^ 0x8000000080000000;
    local_138 = -local_138;
    uStack_134 = in_XMM3_Db ^ 0x80000000;
    uStack_12c = in_XMM3_Dd ^ 0x80000000;
    uStack_130 = 0x80000000;
  }
  fVar44 = local_48._0_4_;
  if (fVar44 <= 0.0) {
    local_b8.bottom = &this->bottom;
    local_b8.top = (DielectricInterfaceBxDF *)0x0;
  }
  else {
    local_b8.bottom = (IdealDiffuseBxDF *)0x0;
    local_b8.top = &this->top;
  }
  fVar45 = fVar44 * local_138;
  if (0.0 < fVar44 == 0.0 < fVar45) {
    local_1e8.bottom = (IdealDiffuseBxDF *)0x0;
    local_1e8.top = &this->top;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = &this->bottom;
    local_f8 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
               (auVar43 << 0x40);
  }
  else {
    auVar42._8_8_ = 0;
    auVar42._0_8_ = &this->bottom;
    local_1e8 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
                (auVar42 << 0x40);
    local_f8.bottom = (IdealDiffuseBxDF *)0x0;
    local_f8.top = &this->top;
  }
  local_88 = ZEXT416((uint)this->thickness);
  local_108 = 0.0;
  fStack_104 = 0.0;
  fStack_100 = 0.0;
  fStack_fc = 0.0;
  if (0.0 < fVar45) {
    auVar48._0_4_ = (float)(this->config).nSamples;
    auVar48._4_12_ = in_ZMM4._4_12_;
    if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)local_b8.top ==
        (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0) {
      auVar2._8_4_ = 0x3ea2f983;
      auVar2._0_8_ = 0x3ea2f9833ea2f983;
      auVar2._12_4_ = 0x3ea2f983;
      auVar42 = vmulps_avx512vl(*(undefined1 (*) [16])((local_b8.bottom)->R).values.values,auVar2);
      auVar43 = vshufpd_avx(auVar42,auVar42,1);
    }
    else {
      VVar98.super_Tuple3<pbrt::Vector3,_float>.z = fVar44;
      VVar98.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_98;
      VVar98.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_98._4_4_;
      auVar93 = ZEXT856(local_48._8_8_);
      auVar71 = ZEXT856(uStack_90);
      wi_00.super_Tuple3<pbrt::Vector3,_float>.z = local_138;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_e8;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_e8._4_4_;
      local_1b8 = auVar48;
      SVar99 = DielectricInterfaceBxDF::f(local_b8.top,VVar98,wi_00,mode);
      auVar88._0_8_ = SVar99.values.values._8_8_;
      auVar88._8_56_ = auVar93;
      auVar43 = auVar88._0_16_;
      auVar89._0_8_ = SVar99.values.values._0_8_;
      auVar89._8_56_ = auVar71;
      auVar42 = auVar89._0_16_;
      auVar48 = local_1b8;
    }
    auVar43 = vmovlhps_avx(auVar42,auVar43);
    fStack_fc = auVar48._0_4_;
    local_108 = auVar43._0_4_ * fStack_fc;
    fStack_104 = auVar43._4_4_ * fStack_fc;
    fStack_100 = auVar43._8_4_ * fStack_fc;
    fStack_fc = auVar43._12_4_ * fStack_fc;
  }
  bVar37 = (this->config).nSamples;
  if (bVar37 != 0) {
    uVar40 = local_98 * -0x395b586ca42e166b;
    uVar40 = (CONCAT44((int)(uVar40 >> 0x20),local_48._0_4_) ^
             ((uVar40 >> 0x2f ^ uVar40) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar40 = (uVar40 >> 0x2f ^ uVar40) * -0x395b586ca42e166b;
    uVar40 = (*Options & 0xffffff ^ uVar40 ^ 0x1a929e4d6f47a654 ^
             (uVar40 >> 0x2f | (ulong)(*Options & 0xff000000))) * -0x395b586ca42e166b;
    uVar40 = (uVar40 >> 0x2f ^ uVar40) * -0x395b586ca42e166b;
    lVar1 = (uVar40 >> 0x2f ^ uVar40) * 2 + 1;
    local_88._0_4_ = (uint)(0.0 < fVar44 == 0.0 < fVar45) * local_88._0_4_;
    uVar40 = (CONCAT44(0x4fb7dae8,local_138) ^
             ((local_e8 * -0x395b586ca42e166b >> 0x2f ^ local_e8 * -0x395b586ca42e166b) *
              -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b) * -0x395b586ca42e166b
    ;
    uVar40 = (uVar40 >> 0x2f ^ uVar40) * -0x395b586ca42e166b;
    uVar40 = (uVar40 >> 0x2f ^ uVar40) * 0x5851f42d4c957f2d + lVar1 * 0x5851f42d4c957f2e;
    local_a0 = (TransportMode)(mode == Radiance);
    uVar39 = 0;
    uVar3 = vcmpss_avx512f((undefined1  [16])0x0,local_48,1);
    local_1ca = (ushort)uVar3 & 1;
    TStack_1fc = mode;
    do {
      uVar38 = (uint)(uVar40 >> 0x2d) ^ (uint)(uVar40 >> 0x1b);
      bVar37 = (byte)(uVar40 >> 0x3b);
      auVar22._4_12_ = in_register_00001384;
      auVar22._0_4_ = in_XMM6_Da;
      auVar43 = vcvtusi2ss_avx512f(auVar22,uVar38 >> bVar37 | uVar38 << 0x20 - bVar37);
      auVar43 = vminss_avx(ZEXT416((uint)(auVar43._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
      uVar34 = uVar40 * 0x5851f42d4c957f2d + lVar1;
      uVar35 = uVar34 * 0x5851f42d4c957f2d + lVar1;
      uVar40 = uVar35 * 0x5851f42d4c957f2d + lVar1;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar34;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = uVar35;
      auVar48 = vpunpcklqdq_avx(auVar47,auVar72);
      auVar42 = vpsrlvq_avx2(auVar48,_DAT_005655c0);
      auVar2 = vpsrlvq_avx2(auVar48,_DAT_005655d0);
      auVar42 = vpshufd_avx(auVar42 ^ auVar2,0xe8);
      auVar48 = vpsrlq_avx(auVar48,0x3b);
      auVar48 = vpshufd_avx(auVar48,0xe8);
      auVar42 = vprorvd_avx512vl(auVar42,auVar48);
      auVar42 = vcvtudq2ps_avx512vl(auVar42);
      auVar4._8_4_ = 0x2f800000;
      auVar4._0_8_ = 0x2f8000002f800000;
      auVar4._12_4_ = 0x2f800000;
      auVar42 = vmulps_avx512vl(auVar42,auVar4);
      auVar5._8_4_ = 0x3f7fffff;
      auVar5._0_8_ = 0x3f7fffff3f7fffff;
      auVar5._12_4_ = 0x3f7fffff;
      auVar42 = vminps_avx512vl(auVar42,auVar5);
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_48._0_4_;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_98;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_98._4_4_;
      TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                ((optional<pbrt::BSDFSample> *)local_78,&local_b8,wo_00,auVar43._0_4_,
                 (Point2f)auVar42._0_8_,mode,Transmission);
      if (local_4c == true) {
        if (((float)local_78 == 0.0) && (!NAN((float)local_78))) {
          uVar34 = 0;
          while (uVar35 = uVar34, uVar35 != 3) {
            if ((afStack_74[uVar35] != 0.0) || (uVar34 = uVar35 + 1, NAN(afStack_74[uVar35])))
            break;
          }
          if (2 < uVar35) goto LAB_0031b913;
        }
        if (((afStack_74[6] != 0.0) || (NAN(afStack_74[6]))) &&
           ((afStack_74[5] != 0.0 || (NAN(afStack_74[5]))))) {
          auVar73._4_4_ = afStack_74[5];
          auVar73._0_4_ = afStack_74[5];
          auVar73._8_4_ = afStack_74[5];
          auVar73._12_4_ = afStack_74[5];
          auVar6._8_4_ = 0x7fffffff;
          auVar6._0_8_ = 0x7fffffff7fffffff;
          auVar6._12_4_ = 0x7fffffff;
          auVar43 = vandps_avx512vl(auVar73,auVar6);
          auVar74._0_4_ = auVar43._0_4_ * (float)local_78;
          auVar74._4_4_ = auVar43._4_4_ * afStack_74[0];
          auVar74._8_4_ = auVar43._8_4_ * afStack_74[1];
          auVar74._12_4_ = auVar43._12_4_ * afStack_74[2];
          auVar49._4_4_ = afStack_74[6];
          auVar49._0_4_ = afStack_74[6];
          auVar49._8_4_ = afStack_74[6];
          auVar49._12_4_ = afStack_74[6];
          _local_1f8 = vdivps_avx(auVar74,auVar49);
          local_208.super_Tuple3<pbrt::Vector3,_float>.z = afStack_74[5];
          local_208.super_Tuple3<pbrt::Vector3,_float>.x = afStack_74[3];
          local_208.super_Tuple3<pbrt::Vector3,_float>.y = afStack_74[4];
          local_1c8 = ZEXT416((uint)((byte)local_1ca & 1) * (int)this->thickness);
          local_10c = this->g;
          uVar38 = (uint)(uVar40 >> 0x2d) ^ (uint)(uVar40 >> 0x1b);
          bVar37 = (byte)(uVar40 >> 0x3b);
          auVar23._4_12_ = in_register_00001384;
          auVar23._0_4_ = in_XMM6_Da;
          auVar43 = vcvtusi2ss_avx512f(auVar23,uVar38 >> bVar37 | uVar38 << 0x20 - bVar37);
          auVar43 = vminss_avx(ZEXT416((uint)(auVar43._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          uVar40 = uVar40 * 0x5851f42d4c957f2d + lVar1;
          uVar34 = uVar40 * 0x5851f42d4c957f2d + lVar1;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = uVar40;
          auVar75._8_8_ = 0;
          auVar75._0_8_ = uVar34;
          auVar48 = vpunpcklqdq_avx(auVar50,auVar75);
          auVar42 = vpsrlvq_avx2(auVar48,_DAT_005655c0);
          auVar2 = vpsrlvq_avx2(auVar48,_DAT_005655d0);
          auVar42 = vpshufd_avx(auVar42 ^ auVar2,0xe8);
          auVar48 = vpsrlq_avx(auVar48,0x3b);
          auVar48 = vpshufd_avx(auVar48,0xe8);
          auVar42 = vprorvd_avx512vl(auVar42,auVar48);
          auVar42 = vcvtudq2ps_avx512vl(auVar42);
          auVar7._8_4_ = 0x2f800000;
          auVar7._0_8_ = 0x2f8000002f800000;
          auVar7._12_4_ = 0x2f800000;
          auVar42 = vmulps_avx512vl(auVar42,auVar7);
          auVar8._8_4_ = 0x3f7fffff;
          auVar8._0_8_ = 0x3f7fffff3f7fffff;
          auVar8._12_4_ = 0x3f7fffff;
          auVar42 = vminps_avx512vl(auVar42,auVar8);
          this_00 = (code *)&local_1e8;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.z = local_138;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_e8;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_e8._4_4_;
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                    ((optional<pbrt::BSDFSample> *)local_178,
                     (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                     this_00,wo_01,auVar43._0_4_,(Point2f)auVar42._0_8_,local_a0,Transmission);
          uVar40 = uVar34 * 0x5851f42d4c957f2d + lVar1;
          if (local_14c == true) {
            if (((float)local_178 == 0.0) && (!NAN((float)local_178))) {
              uVar34 = 0;
              while (uVar35 = uVar34, uVar35 != 3) {
                if ((afStack_174[uVar35] != 0.0) || (uVar34 = uVar35 + 1, NAN(afStack_174[uVar35])))
                break;
              }
              if (2 < uVar35) goto LAB_0031b8fc;
            }
            if ((((local_168[1].super_Tuple3<pbrt::Vector3,_float>.x != 0.0) ||
                 (NAN(local_168[1].super_Tuple3<pbrt::Vector3,_float>.x))) &&
                ((local_168[0].super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
                 (NAN(local_168[0].super_Tuple3<pbrt::Vector3,_float>.z))))) &&
               ((this->config).maxDepth != '\0')) {
              auVar43 = vfmadd213ss_fma(ZEXT416((uint)local_10c),ZEXT416((uint)local_10c),
                                        SUB6416(ZEXT464(0x3f800000),0));
              local_110 = auVar43._0_4_;
              local_114 = local_10c + local_10c;
              auVar43 = vfnmadd213ss_fma(ZEXT416((uint)local_10c),ZEXT416((uint)local_10c),
                                         SUB6416(ZEXT464(0x3f800000),0));
              local_118 = auVar43._0_4_ * 0.07957747;
              uVar38 = 0;
              uVar34 = uVar40;
              uVar3 = local_1c8._0_8_;
              uVar28 = local_1c8._8_8_;
              do {
                TVar41 = TStack_1fc;
                mode_00 = (TransportMode)this_00;
                local_1c8._8_8_ = uVar28;
                local_1c8._0_8_ = uVar3;
                local_9c = uVar38;
                if (3 < uVar38) {
                  lVar36 = 1;
                  auVar66 = ZEXT464((uint)local_1f8);
                  auVar89 = ZEXT464((uint)local_1f8);
                  do {
                    auVar43 = vmaxss_avx(ZEXT416(*(uint *)(local_1f8 + lVar36 * 4)),auVar89._0_16_);
                    auVar89 = ZEXT1664(auVar43);
                    lVar36 = lVar36 + 1;
                  } while (lVar36 != 4);
                  if (auVar43._0_4_ < 0.25) {
                    lVar36 = 1;
                    do {
                      auVar43 = vmaxss_avx(ZEXT416(*(uint *)(local_1f8 + lVar36 * 4)),auVar66._0_16_
                                          );
                      auVar66 = ZEXT1664(auVar43);
                      lVar36 = lVar36 + 1;
                    } while (lVar36 != 4);
                    auVar43 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar43._0_4_)),ZEXT416(0));
                    uVar40 = uVar34 * 0x5851f42d4c957f2d + lVar1;
                    uVar38 = (uint)(uVar34 >> 0x2d) ^ (uint)(uVar34 >> 0x1b);
                    bVar37 = (byte)(uVar34 >> 0x3b);
                    auVar24._4_12_ = in_register_00001384;
                    auVar24._0_4_ = in_XMM6_Da;
                    auVar42 = vcvtusi2ss_avx512f(auVar24,uVar38 >> bVar37 | uVar38 << 0x20 - bVar37)
                    ;
                    auVar42 = vminss_avx(ZEXT416((uint)(auVar42._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    if (auVar42._0_4_ < auVar43._0_4_) break;
                    fVar44 = 1.0 - auVar43._0_4_;
                    auVar51._4_4_ = fVar44;
                    auVar51._0_4_ = fVar44;
                    auVar51._8_4_ = fVar44;
                    auVar51._12_4_ = fVar44;
                    _local_1f8 = vdivps_avx(_local_1f8,auVar51);
                    uVar34 = uVar40;
                  }
                }
                fVar44 = (this->albedo).values.values[0];
                if ((fVar44 != 0.0) || (NAN(fVar44))) {
LAB_0031babd:
                  uVar38 = (uint)(uVar34 >> 0x2d) ^ (uint)(uVar34 >> 0x1b);
                  bVar37 = (byte)(uVar34 >> 0x3b);
                  auVar25._4_12_ = in_register_00001384;
                  auVar25._0_4_ = in_XMM6_Da;
                  auVar43 = vcvtusi2ss_avx512f(auVar25,uVar38 >> bVar37 | uVar38 << 0x20 - bVar37);
                  auVar43 = vminss_avx(ZEXT416((uint)(auVar43._0_4_ * 2.3283064e-10)),
                                       ZEXT416(0x3f7fffff));
                  local_1b8 = ZEXT416((uint)local_208.super_Tuple3<pbrt::Vector3,_float>.z);
                  afStack_d4[3] = logf(1.0 - auVar43._0_4_);
                  auVar52._0_12_ = ZEXT412(0);
                  auVar52._12_4_ = 0;
                  uVar3 = vcmpss_avx512f(auVar52,ZEXT416((uint)local_208.
                                                               super_Tuple3<pbrt::Vector3,_float>.z)
                                         ,1);
                  local_148._0_2_ = (ushort)uVar3 & 1;
                  fStack_c4 = extraout_XMM0_Db;
                  fStack_c0 = extraout_XMM0_Dc;
                  fStack_bc = extraout_XMM0_Dd;
                  if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>::
                       f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg == '\0'
                      ) && (iVar33 = __cxa_guard_acquire(&
                                                  LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>
                                                  ::
                                                  f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                                  ::reg), iVar33 != 0)) {
                    this_00 = const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__;
                    StatRegisterer::StatRegisterer
                              ((StatRegisterer *)
                               &LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>::
                                f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::
                                reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                               (PixelAccumFunc)0x0);
                    __cxa_guard_release(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>
                                         ::
                                         f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                         ::reg);
                    TVar41 = TStack_1fc;
                  }
                  uVar34 = uVar34 * 0x5851f42d4c957f2d + lVar1;
                  auVar9._8_4_ = 0x7fffffff;
                  auVar9._0_8_ = 0x7fffffff7fffffff;
                  auVar9._12_4_ = 0x7fffffff;
                  auVar43 = vandps_avx512vl(local_1b8,auVar9);
                  fVar44 = -afStack_d4[3] / (1.0 / auVar43._0_4_);
                  fVar45 = local_1c8._0_4_;
                  fVar44 = fVar45 + (float)((uint)(local_148[0] & 1) * (int)fVar44 +
                                           (uint)!(bool)(local_148[0] & 1) * (int)-fVar44);
                  *(long *)(in_FS_OFFSET + -0x578) = *(long *)(in_FS_OFFSET + -0x578) + 1;
                  if ((fVar45 != fVar44) || (NAN(fVar45) || NAN(fVar44))) {
                    local_1b8 = ZEXT416((uint)fVar44);
                    if ((fVar44 <= 0.0) || (this->thickness <= fVar44)) {
                      uVar3 = vcmpss_avx512f(local_1b8,ZEXT816(0) << 0x20,1);
                      auVar43 = vminss_avx(ZEXT416((uint)this->thickness),local_1b8);
                      local_1b8._4_12_ = auVar43._4_12_;
                      local_1b8._0_4_ = (uint)!(bool)((byte)uVar3 & 1) * auVar43._0_4_;
                      bVar31 = true;
                    }
                    else {
                      BVar32 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                               ::Flags(&local_1e8);
                      auVar43 = SUB6416(ZEXT464(0x3f800000),0);
                      if ((BVar32 & Specular) == Unset) {
                        if (local_14c == false) {
                          LogFatal<char_const(&)[4]>
                                    (Fatal,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                     ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
                        }
                        auVar43 = vfmadd231ss_fma(ZEXT416((uint)(local_208.
                                                                 super_Tuple3<pbrt::Vector3,_float>.
                                                                 y * local_168[0].
                                                                                                                                          
                                                  super_Tuple3<pbrt::Vector3,_float>.y)),
                                                  ZEXT416((uint)local_208.
                                                                super_Tuple3<pbrt::Vector3,_float>.x
                                                         ),ZEXT416((uint)local_168[0].
                                                                                                                                                  
                                                  super_Tuple3<pbrt::Vector3,_float>.x));
                        auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)local_208.
                                                                                                                                                
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                                                  ZEXT416((uint)local_168[0].
                                                                super_Tuple3<pbrt::Vector3,_float>.z
                                                         ));
                        auVar42 = vfmadd213ss_fma(auVar43,ZEXT416((uint)local_114),
                                                  ZEXT416(local_110));
                        auVar76._0_12_ = ZEXT812(0);
                        auVar76._12_4_ = 0;
                        auVar43 = vmaxss_avx(auVar42,auVar76);
                        if (auVar43._0_4_ < 0.0) {
                          local_148._0_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                          afStack_d4[3] = auVar42._0_4_;
                          fVar45 = sqrtf(auVar43._0_4_);
                          fVar44 = afStack_d4[3];
                        }
                        else {
                          auVar43 = vsqrtss_avx(auVar43,auVar43);
                          fVar45 = auVar43._0_4_;
                          local_148._0_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                          fVar44 = auVar42._0_4_;
                        }
                        fVar44 = local_118 / (fVar45 * fVar44);
                        auVar43 = ZEXT416((uint)(((float)local_148._0_4_ * (float)local_148._0_4_) /
                                                ((float)local_148._0_4_ * (float)local_148._0_4_ +
                                                fVar44 * fVar44)));
                      }
                      _local_148 = auVar43;
                      if (local_14c == false) {
LAB_0031c8b1:
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
                      }
                      afStack_d4[3] = (this->albedo).values.values[0] * (float)local_1f8;
                      fStack_c4 = (this->albedo).values.values[1] * afStack_1f4[0];
                      fStack_c0 = (this->albedo).values.values[2] * afStack_1f4[1];
                      fStack_bc = (this->albedo).values.values[3] * afStack_1f4[2];
                      auVar43 = vfmadd231ss_fma(ZEXT416((uint)(local_208.
                                                               super_Tuple3<pbrt::Vector3,_float>.y
                                                              * local_168[0].
                                                                super_Tuple3<pbrt::Vector3,_float>.y
                                                              )),
                                                ZEXT416((uint)local_208.
                                                              super_Tuple3<pbrt::Vector3,_float>.x),
                                                ZEXT416((uint)local_168[0].
                                                              super_Tuple3<pbrt::Vector3,_float>.x))
                      ;
                      auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)local_208.
                                                                                                                                            
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                                                ZEXT416((uint)local_168[0].
                                                              super_Tuple3<pbrt::Vector3,_float>.z))
                      ;
                      auVar43 = vfmadd213ss_fma(auVar43,ZEXT416((uint)local_114),ZEXT416(local_110))
                      ;
                      auVar79._0_12_ = ZEXT812(0);
                      auVar79._12_4_ = 0;
                      local_a4 = auVar43._0_4_;
                      auVar43 = vmaxss_avx(auVar43,auVar79);
                      if (auVar43._0_4_ < 0.0) {
                        local_11c = sqrtf(auVar43._0_4_);
                      }
                      else {
                        auVar43 = vsqrtss_avx(auVar43,auVar43);
                        local_11c = auVar43._0_4_;
                      }
                      if (local_14c != true) goto LAB_0031c8b1;
                      local_a8 = (float)local_1b8._0_4_ - (float)local_88._0_4_;
                      FVar46 = Tr(local_a8,local_168);
                      if (local_14c != true) goto LAB_0031c8b1;
                      fVar44 = local_118 / (local_11c * local_a4);
                      auVar54._0_4_ =
                           FVar46 * (float)local_148._0_4_ * fVar44 * afStack_d4[3] *
                           (float)local_178;
                      auVar54._4_4_ =
                           FVar46 * (float)local_148._0_4_ * fVar44 * fStack_c4 * afStack_174[0];
                      auVar54._8_4_ =
                           FVar46 * (float)local_148._0_4_ * fVar44 * fStack_c0 * afStack_174[1];
                      auVar54._12_4_ =
                           FVar46 * (float)local_148._0_4_ * fVar44 * fStack_bc * afStack_174[2];
                      auVar19._4_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar19._0_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar19._8_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar19._12_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      _local_148 = vdivps_avx512vl(auVar54,auVar19);
                      auVar55._0_8_ =
                           local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                      auVar55._8_4_ = 0x80000000;
                      auVar55._12_4_ = 0x80000000;
                      wo_04.super_Tuple3<pbrt::Vector3,_float>.z =
                           -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                      uVar35 = uVar34 * 0x5851f42d4c957f2d + lVar1;
                      auVar94._8_8_ = 0;
                      auVar94._0_8_ = uVar34;
                      auVar96._8_8_ = 0;
                      auVar96._0_8_ = uVar35;
                      auVar42 = vpunpcklqdq_avx(auVar94,auVar96);
                      auVar43 = vpsrlvq_avx2(auVar42,_DAT_005655c0);
                      auVar48 = vpsrlvq_avx2(auVar42,_DAT_005655d0);
                      auVar43 = vpshufd_avx(auVar43 ^ auVar48,0xe8);
                      auVar42 = vpsrlq_avx(auVar42,0x3b);
                      auVar42 = vpshufd_avx(auVar42,0xe8);
                      auVar43 = vprorvd_avx512vl(auVar43,auVar42);
                      auVar43 = vcvtudq2ps_avx512vl(auVar43);
                      auVar20._8_4_ = 0x2f800000;
                      auVar20._0_8_ = 0x2f8000002f800000;
                      auVar20._12_4_ = 0x2f800000;
                      auVar43 = vmulps_avx512vl(auVar43,auVar20);
                      auVar21._8_4_ = 0x3f7fffff;
                      auVar21._0_8_ = 0x3f7fffff3f7fffff;
                      auVar21._12_4_ = 0x3f7fffff;
                      auVar43 = vminps_avx512vl(auVar43,auVar21);
                      wo_04.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar55._0_8_;
                      wo_04.super_Tuple3<pbrt::Vector3,_float>.y =
                           (float)(int)(auVar55._0_8_ >> 0x20);
                      auVar71 = ZEXT856(auVar55._8_8_);
                      VVar98 = SampleHenyeyGreenstein
                                         (wo_04,local_10c,(Point2f)auVar43._0_8_,(Float *)local_d8);
                      VStack_1a4.super_Tuple3<pbrt::Vector3,_float>.z =
                           VVar98.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar67._0_8_ = VVar98.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                      auVar67._8_56_ = auVar71;
                      local_108 = local_108 + (float)local_148._0_4_;
                      fStack_104 = fStack_104 + (float)local_148._4_4_;
                      fStack_100 = fStack_100 + fStack_140;
                      fStack_fc = fStack_fc + fStack_13c;
                      local_198[0].super_Tuple3<pbrt::Vector3,_float>.y =
                           (float)CONCAT31(local_198[0].super_Tuple3<pbrt::Vector3,_float>.y._1_3_,1
                                          );
                      local_1a8 = local_d8;
                      uVar40 = vmovlps_avx(auVar67._0_16_);
                      VStack_1a4.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar40;
                      VStack_1a4.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar40 >> 0x20)
                      ;
                      local_198[0].super_Tuple3<pbrt::Vector3,_float>.x = (float)local_d8;
                      if ((((float)local_d8 == 0.0) && (!NAN((float)local_d8))) ||
                         ((VStack_1a4.super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
                          (!NAN(VStack_1a4.super_Tuple3<pbrt::Vector3,_float>.z))))) {
                        local_1b8 = local_1c8;
                      }
                      else {
                        auVar56._4_4_ = local_d8;
                        auVar56._0_4_ = local_d8;
                        auVar56._8_4_ = local_d8;
                        auVar56._12_4_ = local_d8;
                        auVar80._0_4_ = (float)local_d8 * (this->albedo).values.values[0];
                        auVar80._4_4_ = (float)local_d8 * (this->albedo).values.values[1];
                        auVar80._8_4_ = (float)local_d8 * (this->albedo).values.values[2];
                        auVar80._12_4_ = (float)local_d8 * (this->albedo).values.values[3];
                        auVar43 = vdivps_avx(auVar80,auVar56);
                        afStack_1f4[0] = auVar43._4_4_ * afStack_1f4[0];
                        local_1f8 = (undefined1  [4])(auVar43._0_4_ * (float)local_1f8);
                        afStack_1f4[1] = auVar43._8_4_ * afStack_1f4[1];
                        afStack_1f4[2] = auVar43._12_4_ * afStack_1f4[2];
                        local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar40;
                        local_208.super_Tuple3<pbrt::Vector3,_float>.z =
                             VStack_1a4.super_Tuple3<pbrt::Vector3,_float>.z;
                        BVar32 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                 ::Flags(&local_1e8);
                        if ((BVar32 & Specular) == Unset) {
                          auVar81._0_4_ = -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                          auVar81._4_4_ = 0x80000000;
                          auVar81._8_4_ = 0x80000000;
                          auVar81._12_4_ = 0x80000000;
                          auVar57._0_8_ =
                               local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                               0x8000000080000000;
                          auVar57._8_4_ = 0x80000000;
                          auVar57._12_4_ = 0x80000000;
                          this_00 = (code *)(ulong)TVar41;
                          wo_05.super_Tuple3<pbrt::Vector3,_float>.z = auVar81._0_4_;
                          wo_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar57._0_8_;
                          wo_05.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)(int)(auVar57._0_8_ >> 0x20);
                          auVar93 = ZEXT856(auVar81._8_8_);
                          auVar71 = ZEXT856(auVar57._8_8_);
                          wi_02.super_Tuple3<pbrt::Vector3,_float>.z = local_138;
                          wi_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_e8;
                          wi_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_e8._4_4_;
                          SVar99 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                   ::f(&local_1e8,wo_05,wi_02,TVar41);
                          auVar90._0_8_ = SVar99.values.values._8_8_;
                          auVar90._8_56_ = auVar93;
                          auVar68._0_8_ = SVar99.values.values._0_8_;
                          auVar68._8_56_ = auVar71;
                          _local_d8 = vmovlhps_avx(auVar68._0_16_,auVar90._0_16_);
                          if (((float)local_d8 == 0.0) && (!NAN((float)local_d8))) {
                            uVar40 = 0;
                            while (uVar34 = uVar40, uVar34 != 3) {
                              if ((*(float *)(local_d8 + uVar34 * 4 + 4) != 0.0) ||
                                 (uVar40 = uVar34 + 1, NAN(*(float *)(local_d8 + uVar34 * 4 + 4))))
                              break;
                            }
                            if (2 < uVar34) goto LAB_0031c813;
                          }
                          if (local_1e8.top == (DielectricInterfaceBxDF *)0x0) {
                            FVar46 = 0.0;
                          }
                          else {
                            wo_06.super_Tuple3<pbrt::Vector3,_float>.z =
                                 -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                            wo_06.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                                 local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                                 0x8000000080000000;
                            wi_03.super_Tuple3<pbrt::Vector3,_float>.z = local_138;
                            wi_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_e8
                            ;
                            wi_03.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_e8._4_4_;
                            FVar46 = DielectricInterfaceBxDF::PDF
                                               (local_1e8.top,wo_06,wi_03,(TransportMode)this_00,
                                                Transmission);
                          }
                          local_1c8._0_4_ = FVar46;
                          if (local_198[0].super_Tuple3<pbrt::Vector3,_float>.y._0_1_ == '\0') {
                            LogFatal<char_const(&)[4]>
                                      (Fatal,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                       ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
                          }
                          local_148._0_4_ = local_198[0].super_Tuple3<pbrt::Vector3,_float>.x;
                          FVar46 = Tr(local_a8,&VStack_1a4);
                          fVar44 = ((float)local_148._0_4_ * (float)local_148._0_4_) /
                                   ((float)local_1c8._0_4_ * (float)local_1c8._0_4_ +
                                   (float)local_148._0_4_ * (float)local_148._0_4_);
                          local_108 = fVar44 * FVar46 * (float)local_1f8 * (float)local_d8 +
                                      local_108;
                          fStack_104 = fVar44 * FVar46 * afStack_1f4[0] * afStack_d4[0] + fStack_104
                          ;
                          fStack_100 = fVar44 * FVar46 * afStack_1f4[1] * afStack_d4[1] + fStack_100
                          ;
                          fStack_fc = fVar44 * FVar46 * afStack_1f4[2] * afStack_d4[2] + fStack_fc;
                        }
                      }
LAB_0031c813:
                      if (local_198[0].super_Tuple3<pbrt::Vector3,_float>.y._0_1_ == '\x01') {
                        local_198[0].super_Tuple3<pbrt::Vector3,_float>.y =
                             (float)((uint)local_198[0].super_Tuple3<pbrt::Vector3,_float>.y &
                                    0xffffff00);
                      }
                      uVar34 = uVar35 * 0x5851f42d4c957f2d + lVar1;
                      bVar31 = false;
                    }
                  }
                  else {
                    *(long *)(in_FS_OFFSET + -0x580) = *(long *)(in_FS_OFFSET + -0x580) + 1;
                    bVar31 = false;
                    local_1b8 = local_1c8;
                  }
                  mode_00 = (TransportMode)this_00;
                  uVar40 = uVar34;
                  if (bVar31) goto LAB_0031bcc9;
                }
                else {
                  uVar40 = 0;
                  while (uVar35 = uVar40, uVar35 != 3) {
                    fVar44 = (this->albedo).values.values[uVar35 + 1];
                    if ((fVar44 != 0.0) || (uVar40 = uVar35 + 1, NAN(fVar44))) break;
                  }
                  if (uVar35 < 3) goto LAB_0031babd;
                  local_1b8 = ZEXT416((uint)this->thickness);
                  FVar46 = Tr(this->thickness,&local_208);
                  uVar3 = vcmpss_avx512f(local_1b8,ZEXT416((uint)local_1c8._0_4_),0);
                  local_1b8._0_4_ = (uint)!(bool)((byte)uVar3 & 1) * local_1b8._0_4_;
                  afStack_1f4[0] = FVar46 * afStack_1f4[0];
                  local_1f8 = (undefined1  [4])(FVar46 * (float)local_1f8);
                  afStack_1f4[1] = FVar46 * afStack_1f4[1];
                  afStack_1f4[2] = FVar46 * afStack_1f4[2];
LAB_0031bcc9:
                  bVar37 = (byte)(uVar34 >> 0x38);
                  uVar38 = (uint)(uVar34 >> 0x20);
                  if (((float)local_1b8._0_4_ != (float)local_88._0_4_) ||
                     (NAN((float)local_1b8._0_4_) || NAN((float)local_88._0_4_))) {
                    BVar32 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                             ::Flags(&local_f8);
                    if ((BVar32 & Specular) == Unset) {
                      BVar32 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                               ::Flags(&local_1e8);
                      auVar43 = SUB6416(ZEXT464(0x3f800000),0);
                      if ((BVar32 & Specular) == Unset) {
                        if (local_14c == false) {
                          LogFatal<char_const(&)[4]>
                                    (Fatal,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                     ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
                        }
                        if (local_f8.top == (DielectricInterfaceBxDF *)0x0) {
                          auVar18._8_4_ = 0x7fffffff;
                          auVar18._0_8_ = 0x7fffffff7fffffff;
                          auVar18._12_4_ = 0x7fffffff;
                          auVar43 = vandps_avx512vl(ZEXT416((uint)local_168[0].
                                                                  super_Tuple3<pbrt::Vector3,_float>
                                                                  .z),auVar18);
                          uVar3 = vcmpss_avx512f(ZEXT416((uint)(local_208.
                                                                super_Tuple3<pbrt::Vector3,_float>.z
                                                               * local_168[0].
                                                                 super_Tuple3<pbrt::Vector3,_float>.
                                                                 z)),ZEXT416(0),0xe);
                          fVar44 = (float)((uint)((byte)uVar3 & 1) *
                                          (int)(auVar43._0_4_ * 0.31830987));
                          local_1c8._0_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                        }
                        else {
                          local_1c8._0_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                          wi_01.super_Tuple3<pbrt::Vector3,_float>.z =
                               -local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                          wo_03.super_Tuple3<pbrt::Vector3,_float>.z =
                               -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                          wo_03.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                               local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                               0x8000000080000000;
                          wi_01.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                               CONCAT44(local_168[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                        local_168[0].super_Tuple3<pbrt::Vector3,_float>.x) ^
                               0x8000000080000000;
                          fVar44 = DielectricInterfaceBxDF::PDF
                                             (local_f8.top,wo_03,wi_01,mode_00,All);
                        }
                        auVar43 = ZEXT416((uint)(((float)local_1c8._0_4_ * (float)local_1c8._0_4_) /
                                                ((float)local_1c8._0_4_ * (float)local_1c8._0_4_ +
                                                fVar44 * fVar44)));
                      }
                      local_1c8 = auVar43;
                      if (local_14c == false) {
LAB_0031c8d5:
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
                      }
                      if (local_f8.top == (DielectricInterfaceBxDF *)0x0) {
                        auVar83._0_12_ = ZEXT812(0);
                        auVar83._12_4_ = 0;
                        auVar59._0_12_ = ZEXT812(0);
                        auVar59._12_4_ = 0.0;
                        if (0.0 < local_208.super_Tuple3<pbrt::Vector3,_float>.z *
                                  local_168[0].super_Tuple3<pbrt::Vector3,_float>.z) {
                          auVar59._0_4_ = ((local_f8.bottom)->R).values.values[0] * 0.31830987;
                          auVar59._4_4_ = ((local_f8.bottom)->R).values.values[1] * 0.31830987;
                          auVar59._8_4_ = ((local_f8.bottom)->R).values.values[2] * 0.31830987;
                          auVar59._12_4_ = ((local_f8.bottom)->R).values.values[3] * 0.31830987;
                          auVar83 = vshufpd_avx(auVar59,auVar59,1);
                        }
                      }
                      else {
                        auVar58._0_8_ =
                             local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                        ;
                        auVar58._8_4_ = 0x80000000;
                        auVar58._12_4_ = 0x80000000;
                        auVar82._0_4_ = -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                        auVar82._4_4_ = 0x80000000;
                        auVar82._8_4_ = 0x80000000;
                        auVar82._12_4_ = 0x80000000;
                        wi_04.super_Tuple3<pbrt::Vector3,_float>.z =
                             -local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                        wi_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             CONCAT44(local_168[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                      local_168[0].super_Tuple3<pbrt::Vector3,_float>.x) ^
                             0x8000000080000000;
                        wo_07.super_Tuple3<pbrt::Vector3,_float>.z = auVar82._0_4_;
                        wo_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar58._0_8_;
                        wo_07.super_Tuple3<pbrt::Vector3,_float>.y =
                             (float)(int)(auVar58._0_8_ >> 0x20);
                        auVar93 = ZEXT856(auVar82._8_8_);
                        auVar71 = ZEXT856(auVar58._8_8_);
                        SVar99 = DielectricInterfaceBxDF::f(local_f8.top,wo_07,wi_04,TVar41);
                        auVar91._0_8_ = SVar99.values.values._8_8_;
                        auVar91._8_56_ = auVar93;
                        auVar83 = auVar91._0_16_;
                        auVar69._0_8_ = SVar99.values.values._0_8_;
                        auVar69._8_56_ = auVar71;
                        auVar59 = auVar69._0_16_;
                      }
                      if (local_14c != true) goto LAB_0031c8d5;
                      auVar43 = vmovlhps_avx(auVar59,auVar83);
                      local_148._4_4_ = auVar43._4_4_ * afStack_1f4[0];
                      local_148._0_4_ = auVar43._0_4_ * (float)local_1f8;
                      fStack_140 = auVar43._8_4_ * afStack_1f4[1];
                      fStack_13c = auVar43._12_4_ * afStack_1f4[2];
                      afStack_d4[3] = local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      fStack_c4 = local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      fStack_c0 = local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      fStack_bc = local_168[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      FVar46 = Tr(this->thickness,local_168);
                      if (local_14c != true) goto LAB_0031c8d5;
                      auVar30._4_4_ = fStack_c4;
                      auVar30._0_4_ = afStack_d4[3];
                      auVar30._8_4_ = fStack_c0;
                      auVar30._12_4_ = fStack_bc;
                      auVar13._8_4_ = 0x7fffffff;
                      auVar13._0_8_ = 0x7fffffff7fffffff;
                      auVar13._12_4_ = 0x7fffffff;
                      auVar43 = vandps_avx512vl(auVar30,auVar13);
                      auVar60._0_4_ =
                           FVar46 * (float)local_1c8._0_4_ * auVar43._0_4_ * (float)local_148._0_4_
                           * (float)local_178;
                      auVar60._4_4_ =
                           FVar46 * (float)local_1c8._0_4_ * auVar43._4_4_ * (float)local_148._4_4_
                           * afStack_174[0];
                      auVar60._8_4_ =
                           FVar46 * (float)local_1c8._0_4_ * auVar43._8_4_ * fStack_140 *
                           afStack_174[1];
                      auVar60._12_4_ =
                           FVar46 * (float)local_1c8._0_4_ * auVar43._12_4_ * fStack_13c *
                           afStack_174[2];
                      auVar14._4_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar14._0_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar14._8_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar14._12_4_ = local_168[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar43 = vdivps_avx512vl(auVar60,auVar14);
                      local_108 = auVar43._0_4_ + local_108;
                      fStack_104 = auVar43._4_4_ + fStack_104;
                      fStack_100 = auVar43._8_4_ + fStack_100;
                      fStack_fc = auVar43._12_4_ + fStack_fc;
                    }
                    uVar38 = uVar38 >> 0xd ^ (uint)(uVar34 >> 0x1b);
                    bVar37 = bVar37 >> 3;
                    auVar27._4_12_ = in_register_00001384;
                    auVar27._0_4_ = in_XMM6_Da;
                    auVar43 = vcvtusi2ss_avx512f(auVar27,uVar38 >> bVar37 | uVar38 << 0x20 - bVar37)
                    ;
                    auVar43 = vminss_avx(ZEXT416((uint)(auVar43._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    uVar40 = uVar34 * 0x5851f42d4c957f2d + lVar1;
                    uVar34 = uVar40 * 0x5851f42d4c957f2d + lVar1;
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = uVar40;
                    auVar84._8_8_ = 0;
                    auVar84._0_8_ = uVar34;
                    auVar48 = vpunpcklqdq_avx(auVar61,auVar84);
                    auVar42 = vpsrlvq_avx2(auVar48,_DAT_005655c0);
                    auVar2 = vpsrlvq_avx2(auVar48,_DAT_005655d0);
                    auVar42 = vpshufd_avx(auVar42 ^ auVar2,0xe8);
                    auVar48 = vpsrlq_avx(auVar48,0x3b);
                    auVar48 = vpshufd_avx(auVar48,0xe8);
                    auVar42 = vprorvd_avx512vl(auVar42,auVar48);
                    auVar42 = vcvtudq2ps_avx512vl(auVar42);
                    auVar15._8_4_ = 0x2f800000;
                    auVar15._0_8_ = 0x2f8000002f800000;
                    auVar15._12_4_ = 0x2f800000;
                    auVar42 = vmulps_avx512vl(auVar42,auVar15);
                    auVar16._8_4_ = 0x3f7fffff;
                    auVar16._0_8_ = 0x3f7fffff3f7fffff;
                    auVar16._12_4_ = 0x3f7fffff;
                    auVar42 = vminps_avx512vl(auVar42,auVar16);
                    wo_08.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    wo_08.super_Tuple3<pbrt::Vector3,_float>.z =
                         -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                    this_00 = (code *)&local_f8;
                    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                              ((optional<pbrt::BSDFSample> *)local_1a8,
                               (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                *)this_00,wo_08,auVar43._0_4_,(Point2f)auVar42._0_8_,TStack_1fc,
                               Reflection);
                    TVar41 = TStack_1fc;
                    uVar40 = uVar34 * 0x5851f42d4c957f2d + lVar1;
                    if (local_17c != true) break;
                    if (((float)local_1a8 == 0.0) && (!NAN((float)local_1a8))) {
                      uVar34 = 0;
                      while (uVar35 = uVar34, uVar35 != 3) {
                        fVar44 = (&VStack_1a4.super_Tuple3<pbrt::Vector3,_float>.x)[uVar35];
                        if ((fVar44 != 0.0) || (uVar34 = uVar35 + 1, NAN(fVar44))) break;
                      }
                      if (2 < uVar35) goto LAB_0031c86c;
                    }
                    if (((local_198[1].super_Tuple3<pbrt::Vector3,_float>.x == 0.0) &&
                        (!NAN(local_198[1].super_Tuple3<pbrt::Vector3,_float>.x))) ||
                       ((local_198[0].super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
                        (!NAN(local_198[0].super_Tuple3<pbrt::Vector3,_float>.z)))))
                    goto LAB_0031c86c;
                    auVar85._4_4_ = local_198[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar85._0_4_ = local_198[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar85._8_4_ = local_198[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar85._12_4_ = local_198[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar17._8_4_ = 0x7fffffff;
                    auVar17._0_8_ = 0x7fffffff7fffffff;
                    auVar17._12_4_ = 0x7fffffff;
                    auVar43 = vandps_avx512vl(auVar85,auVar17);
                    auVar86._0_4_ = auVar43._0_4_ * (float)local_1a8;
                    auVar86._4_4_ = auVar43._4_4_ * VStack_1a4.super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar86._8_4_ = auVar43._8_4_ * VStack_1a4.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar86._12_4_ =
                         auVar43._12_4_ * VStack_1a4.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar62._4_4_ = local_198[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar62._0_4_ = local_198[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar62._8_4_ = local_198[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar62._12_4_ = local_198[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar43 = vdivps_avx(auVar86,auVar62);
                    afStack_1f4[0] = auVar43._4_4_ * afStack_1f4[0];
                    local_1f8 = (undefined1  [4])(auVar43._0_4_ * (float)local_1f8);
                    afStack_1f4[1] = auVar43._8_4_ * afStack_1f4[1];
                    afStack_1f4[2] = auVar43._12_4_ * afStack_1f4[2];
                    local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         CONCAT44(local_198[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                  local_198[0].super_Tuple3<pbrt::Vector3,_float>.x);
                    local_208.super_Tuple3<pbrt::Vector3,_float>.z =
                         local_198[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    BVar32 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                             ::Flags(&local_1e8);
                    if ((BVar32 & Specular) == Unset) {
                      auVar87._0_4_ = -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar87._4_4_ = 0x80000000;
                      auVar87._8_4_ = 0x80000000;
                      auVar87._12_4_ = 0x80000000;
                      auVar71 = ZEXT856(auVar87._8_8_);
                      if (local_1e8.top == (DielectricInterfaceBxDF *)0x0) {
                        auVar43 = SUB6416(ZEXT864(0),0) << 0x20;
                        auVar64._0_12_ = ZEXT812(0);
                        auVar64._12_4_ = 0.0;
                        if (0.0 < auVar87._0_4_ * local_138) {
                          auVar64._0_4_ = ((local_1e8.bottom)->R).values.values[0] * 0.31830987;
                          auVar64._4_4_ = ((local_1e8.bottom)->R).values.values[1] * 0.31830987;
                          auVar64._8_4_ = ((local_1e8.bottom)->R).values.values[2] * 0.31830987;
                          auVar64._12_4_ = ((local_1e8.bottom)->R).values.values[3] * 0.31830987;
                          auVar43 = vshufpd_avx(auVar64,auVar64,1);
                        }
                      }
                      else {
                        auVar63._0_8_ =
                             local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                        ;
                        auVar63._8_4_ = 0x80000000;
                        auVar63._12_4_ = 0x80000000;
                        this_00 = (code *)(ulong)TVar41;
                        wo_09.super_Tuple3<pbrt::Vector3,_float>.z = auVar87._0_4_;
                        wo_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar63._0_8_;
                        wo_09.super_Tuple3<pbrt::Vector3,_float>.y =
                             (float)(int)(auVar63._0_8_ >> 0x20);
                        auVar93 = ZEXT856(auVar63._8_8_);
                        wi_05.super_Tuple3<pbrt::Vector3,_float>.z = local_138;
                        wi_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_e8;
                        wi_05.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_e8._4_4_;
                        SVar99 = DielectricInterfaceBxDF::f(local_1e8.top,wo_09,wi_05,TVar41);
                        auVar92._0_8_ = SVar99.values.values._8_8_;
                        auVar92._8_56_ = auVar71;
                        auVar43 = auVar92._0_16_;
                        auVar70._0_8_ = SVar99.values.values._0_8_;
                        auVar70._8_56_ = auVar93;
                        auVar64 = auVar70._0_16_;
                      }
                      _local_d8 = vmovlhps_avx(auVar64,auVar43);
                      if (((float)local_d8 == 0.0) && (!NAN((float)local_d8))) {
                        uVar34 = 0;
                        while (uVar35 = uVar34, uVar35 != 3) {
                          if ((*(float *)(local_d8 + uVar35 * 4 + 4) != 0.0) ||
                             (uVar34 = uVar35 + 1, NAN(*(float *)(local_d8 + uVar35 * 4 + 4))))
                          break;
                        }
                        if (2 < uVar35) goto LAB_0031c754;
                      }
                      BVar32 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                               ::Flags(&local_f8);
                      auVar43 = SUB6416(ZEXT464(0x3f800000),0);
                      if ((BVar32 & Specular) == Unset) {
                        if (local_1e8.top == (DielectricInterfaceBxDF *)0x0) {
                          fVar44 = 0.0;
                        }
                        else {
                          wo_10.super_Tuple3<pbrt::Vector3,_float>.z =
                               -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                          wo_10.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                               local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                               0x8000000080000000;
                          wi_06.super_Tuple3<pbrt::Vector3,_float>.z = local_138;
                          wi_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_e8;
                          wi_06.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_e8._4_4_;
                          fVar44 = DielectricInterfaceBxDF::PDF
                                             (local_1e8.top,wo_10,wi_06,(TransportMode)this_00,
                                              Transmission);
                        }
                        if (local_17c == false) {
                          LogFatal<char_const(&)[4]>
                                    (Fatal,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                     ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
                        }
                        auVar43 = ZEXT416((uint)((local_198[1].super_Tuple3<pbrt::Vector3,_float>.x
                                                 * local_198[1].super_Tuple3<pbrt::Vector3,_float>.x
                                                 ) / (fVar44 * fVar44 +
                                                     local_198[1].super_Tuple3<pbrt::Vector3,_float>
                                                     .x * local_198[1].
                                                          super_Tuple3<pbrt::Vector3,_float>.x)));
                      }
                      local_1c8 = auVar43;
                      if (local_17c == false) {
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
                      }
                      FVar46 = Tr(this->thickness,local_198);
                      local_108 = (float)local_1c8._0_4_ *
                                  FVar46 * (float)local_1f8 * (float)local_d8 + local_108;
                      fStack_104 = (float)local_1c8._0_4_ * FVar46 * afStack_1f4[0] * afStack_d4[0]
                                   + fStack_104;
                      fStack_100 = (float)local_1c8._0_4_ * FVar46 * afStack_1f4[1] * afStack_d4[1]
                                   + fStack_100;
                      fStack_fc = (float)local_1c8._0_4_ * FVar46 * afStack_1f4[2] * afStack_d4[2] +
                                  fStack_fc;
                    }
LAB_0031c754:
                    if (local_17c == true) {
                      local_17c = false;
                    }
                  }
                  else {
                    uVar38 = uVar38 >> 0xd ^ (uint)(uVar34 >> 0x1b);
                    bVar37 = bVar37 >> 3;
                    auVar26._4_12_ = in_register_00001384;
                    auVar26._0_4_ = in_XMM6_Da;
                    auVar43 = vcvtusi2ss_avx512f(auVar26,uVar38 >> bVar37 | uVar38 << 0x20 - bVar37)
                    ;
                    auVar43 = vminss_avx(ZEXT416((uint)(auVar43._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    wo_02.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    wo_02.super_Tuple3<pbrt::Vector3,_float>.z =
                         -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                    uVar40 = uVar34 * 0x5851f42d4c957f2d + lVar1;
                    uVar34 = uVar40 * 0x5851f42d4c957f2d + lVar1;
                    auVar95._8_8_ = 0;
                    auVar95._0_8_ = uVar40;
                    auVar97._8_8_ = 0;
                    auVar97._0_8_ = uVar34;
                    auVar48 = vpunpcklqdq_avx(auVar95,auVar97);
                    auVar42 = vpsrlvq_avx2(auVar48,_DAT_005655c0);
                    auVar2 = vpsrlvq_avx2(auVar48,_DAT_005655d0);
                    auVar42 = vpshufd_avx(auVar42 ^ auVar2,0xe8);
                    auVar48 = vpsrlq_avx(auVar48,0x3b);
                    auVar48 = vpshufd_avx(auVar48,0xe8);
                    auVar42 = vprorvd_avx512vl(auVar42,auVar48);
                    auVar42 = vcvtudq2ps_avx512vl(auVar42);
                    auVar10._8_4_ = 0x2f800000;
                    auVar10._0_8_ = 0x2f8000002f800000;
                    auVar10._12_4_ = 0x2f800000;
                    auVar42 = vmulps_avx512vl(auVar42,auVar10);
                    auVar11._8_4_ = 0x3f7fffff;
                    auVar11._0_8_ = 0x3f7fffff3f7fffff;
                    auVar11._12_4_ = 0x3f7fffff;
                    auVar42 = vminps_avx512vl(auVar42,auVar11);
                    this_00 = (code *)&local_1e8;
                    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                              ((optional<pbrt::BSDFSample> *)local_1a8,
                               (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                *)this_00,wo_02,auVar43._0_4_,(Point2f)auVar42._0_8_,TVar41,
                               Reflection);
                    uVar40 = uVar34 * 0x5851f42d4c957f2d + lVar1;
                    if (local_17c != true) break;
                    if (((float)local_1a8 == 0.0) && (!NAN((float)local_1a8))) {
                      uVar34 = 0;
                      while (uVar35 = uVar34, uVar35 != 3) {
                        fVar44 = (&VStack_1a4.super_Tuple3<pbrt::Vector3,_float>.x)[uVar35];
                        if ((fVar44 != 0.0) || (uVar34 = uVar35 + 1, NAN(fVar44))) break;
                      }
                      if (2 < uVar35) goto LAB_0031c86c;
                    }
                    if (((local_198[1].super_Tuple3<pbrt::Vector3,_float>.x == 0.0) &&
                        (!NAN(local_198[1].super_Tuple3<pbrt::Vector3,_float>.x))) ||
                       ((local_198[0].super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
                        (!NAN(local_198[0].super_Tuple3<pbrt::Vector3,_float>.z))))) {
LAB_0031c86c:
                      if (local_17c != false) {
                        local_17c = false;
                      }
                      break;
                    }
                    auVar77._4_4_ = local_198[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar77._0_4_ = local_198[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar77._8_4_ = local_198[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar77._12_4_ = local_198[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar12._8_4_ = 0x7fffffff;
                    auVar12._0_8_ = 0x7fffffff7fffffff;
                    auVar12._12_4_ = 0x7fffffff;
                    auVar43 = vandps_avx512vl(auVar77,auVar12);
                    auVar78._0_4_ = auVar43._0_4_ * (float)local_1a8;
                    auVar78._4_4_ = auVar43._4_4_ * VStack_1a4.super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar78._8_4_ = auVar43._8_4_ * VStack_1a4.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar78._12_4_ =
                         auVar43._12_4_ * VStack_1a4.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar53._4_4_ = local_198[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar53._0_4_ = local_198[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar53._8_4_ = local_198[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar53._12_4_ = local_198[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar43 = vdivps_avx(auVar78,auVar53);
                    afStack_1f4[0] = auVar43._4_4_ * afStack_1f4[0];
                    local_1f8 = (undefined1  [4])(auVar43._0_4_ * (float)local_1f8);
                    afStack_1f4[1] = auVar43._8_4_ * afStack_1f4[1];
                    afStack_1f4[2] = auVar43._12_4_ * afStack_1f4[2];
                    local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         CONCAT44(local_198[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                  local_198[0].super_Tuple3<pbrt::Vector3,_float>.x);
                    local_208.super_Tuple3<pbrt::Vector3,_float>.z =
                         local_198[0].super_Tuple3<pbrt::Vector3,_float>.z;
                  }
                }
                uVar38 = local_9c + 1;
                uVar34 = uVar40;
                uVar3 = local_1b8._0_8_;
                uVar28 = local_1b8._8_8_;
              } while (uVar38 < (this->config).maxDepth);
            }
          }
LAB_0031b8fc:
          mode = TStack_1fc;
          if (local_14c == true) {
            local_14c = false;
          }
        }
      }
LAB_0031b913:
      if (local_4c == true) {
        local_4c = false;
      }
      uVar39 = uVar39 + 1;
      bVar37 = (this->config).nSamples;
    } while (uVar39 < bVar37);
  }
  auVar65._0_4_ = (float)bVar37;
  auVar65._4_4_ = auVar65._0_4_;
  auVar65._8_4_ = auVar65._0_4_;
  auVar65._12_4_ = auVar65._0_4_;
  auVar29._4_4_ = fStack_104;
  auVar29._0_4_ = local_108;
  auVar29._8_4_ = fStack_100;
  auVar29._12_4_ = fStack_fc;
  auVar43 = vdivps_avx(auVar29,auVar65);
  auVar42 = vshufpd_avx(auVar43,auVar43,1);
  SVar99.values.values._0_8_ = auVar43._0_8_;
  SVar99.values.values._8_8_ = auVar42._0_8_;
  return (SampledSpectrum)SVar99.values.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        SampledSpectrum f(0.);
        // Estimate _LayeredBxDF_ value _f_ using random sampling
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            wo = -wo;
            wi = -wi;
        }

        // Determine entrance interface for layered BSDF
        TopOrBottomBxDF<TopBxDF, BottomBxDF> enterInterface;
        bool enteredTop = wo.z > 0;
        if (enteredTop)
            enterInterface = &top;
        else
            enterInterface = &bottom;

        // Determine exit interface and exit $z$ for layered BSDF
        TopOrBottomBxDF<TopBxDF, BottomBxDF> exitInterface, nonExitInterface;
        if (SameHemisphere(wo, wi) ^ enteredTop) {
            exitInterface = &bottom;
            nonExitInterface = &top;
        } else {
            exitInterface = &top;
            nonExitInterface = &bottom;
        }
        Float exitZ = (SameHemisphere(wo, wi) ^ enteredTop) ? 0 : thickness;

        // Account for reflection at the entrance interface
        if (SameHemisphere(wo, wi))
            f = config.nSamples * enterInterface.f(wo, wi, mode);

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        for (int s = 0; s < config.nSamples; ++s) {
            // Sample random walk through layers to estimate BSDF value
            // Sample transmission direction through entrance interface
            Float uc = r();
            pstd::optional<BSDFSample> wos = enterInterface.Sample_f(
                wo, uc, Point2f(r(), r()), mode, BxDFReflTransFlags::Transmission);
            if (!wos || !wos->f || wos->pdf == 0 || wos->wi.z == 0)
                continue;

            // Declare state for random walk through BSDF layers
            SampledSpectrum beta = wos->f * AbsCosTheta(wos->wi) / wos->pdf;
            Vector3f w = wos->wi;
            Float z = enteredTop ? thickness : 0;
            HGPhaseFunction phase(g);

            // Sample BSDF for NEE in _wi_'s direction
            uc = r();
            pstd::optional<BSDFSample> wis = exitInterface.Sample_f(
                wi, uc, Point2f(r(), r()), !mode, BxDFReflTransFlags::Transmission);
            if (!wis || !wis->f || wis->pdf == 0 || wis->wi.z == 0)
                continue;

            for (int depth = 0; depth < config.maxDepth; ++depth) {
                // Sample next event for layered BSDF evaluation random walk
                PBRT_DBG("beta: %f %f %f %f, w: %f %f %f, f: %f %f %f %f\n", beta[0],
                         beta[1], beta[2], beta[3], w.x, w.y, w.z, f[0], f[1], f[2],
                         f[3]);
                // Possibly terminate layered BSDF random walk with Russian Roulette
                if (depth > 3 && beta.MaxComponentValue() < 0.25f) {
                    Float q = std::max<Float>(0, 1 - beta.MaxComponentValue());
                    if (r() < q)
                        break;
                    beta /= 1 - q;
                    PBRT_DBG("After RR with q = %f, beta: %f %f %f %f\n", q, beta[0],
                             beta[1], beta[2], beta[3]);
                }

                // Account for media between layers and possibly scatter
                if (!albedo) {
                    // Advance to next layer boundary and update _beta_ for transmittance
                    z = (z == thickness) ? 0 : thickness;
                    beta *= Tr(thickness, w);

                } else {
                    // Sample medium scattering for layered BSDF evaluation
                    Float sigma_t = 1;
                    Float dz = SampleExponential(r(), sigma_t / std::abs(w.z));
                    Float zp = w.z > 0 ? (z + dz) : (z - dz);
                    CHECK_RARE(1e-5, z == zp);
                    if (z == zp)
                        continue;
                    if (0 < zp && zp < thickness) {
                        // Handle scattering event in layered BSDF medium
                        // Account for scattering through _exitInterface_ using _wis_
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis->pdf, 1, phase.PDF(-w, -wis->wi));
                        f += beta * albedo * phase.p(-w, -wis->wi) * wt *
                             Tr(zp - exitZ, wis->wi) * wis->f / wis->pdf;

                        // Sample phase function and update layered path state
                        pstd::optional<PhaseFunctionSample> ps =
                            phase.Sample_p(-w, Point2f(r(), r()));
                        if (!ps || ps->pdf == 0 || ps->wi.z == 0)
                            continue;
                        beta *= albedo * ps->p / ps->pdf;
                        w = ps->wi;
                        z = zp;

                        if (!IsSpecular(exitInterface.Flags())) {
                            // Account for scattering through _exitInterface_ from new _w_
                            SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                            if (fExit) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                Float weight = PowerHeuristic(1, ps->pdf, 1, exitPDF);
                                f += beta * Tr(zp - exitZ, ps->wi) * fExit * weight;
                            }
                        }

                        continue;
                    }
                    z = Clamp(zp, 0, thickness);
                }

                // Account for scattering at appropriate interface
                if (z == exitZ) {
                    // Account for reflection at _exitInterface_
                    Float uc = r();
                    pstd::optional<BSDFSample> bs = exitInterface.Sample_f(
                        -w, uc, Point2f(r(), r()), mode, BxDFReflTransFlags::Reflection);
                    if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
                        break;
                    beta *= bs->f * AbsCosTheta(bs->wi) / bs->pdf;
                    w = bs->wi;

                } else {
                    // Account for scattering at _nonExitInterface_
                    if (!IsSpecular(nonExitInterface.Flags())) {
                        // Add NEE contribution along pre-sampled _wis_ direction
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis->pdf, 1,
                                                nonExitInterface.PDF(-w, -wis->wi, mode));
                        f += beta * nonExitInterface.f(-w, -wis->wi, mode) *
                             AbsCosTheta(wis->wi) * wt * Tr(thickness, wis->wi) * wis->f /
                             wis->pdf;
                    }
                    // Sample new direction using BSDF at _nonExitInterface_
                    Float uc = r();
                    Point2f u(r(), r());
                    pstd::optional<BSDFSample> bs = nonExitInterface.Sample_f(
                        -w, uc, u, mode, BxDFReflTransFlags::Reflection);
                    if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
                        break;
                    beta *= bs->f * AbsCosTheta(bs->wi) / bs->pdf;
                    w = bs->wi;

                    if (!IsSpecular(exitInterface.Flags())) {
                        // Add NEE contribution along direction from BSDF sample
                        SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                        if (fExit) {
                            Float wt = 1;
                            if (!IsSpecular(nonExitInterface.Flags())) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                wt = PowerHeuristic(1, bs->pdf, 1, exitPDF);
                            }
                            f += beta * Tr(thickness, bs->wi) * fExit * wt;
                        }
                    }
                }
            }
        }

        return f / config.nSamples;
    }